

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReceptiveFieldDecodingSynapse.cpp
# Opt level: O2

void __thiscall ReceptiveFieldDecodingSynapse::resetOutput(ReceptiveFieldDecodingSynapse *this)

{
  pointer ppEVar1;
  Event *pEVar2;
  int i;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    ppEVar1 = (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) <= uVar3) break;
    pEVar2 = ppEVar1[uVar3];
    if (pEVar2 != (Event *)0x0) {
      (*pEVar2->_vptr_Event[2])();
      (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = (Event *)0x0;
    }
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void ReceptiveFieldDecodingSynapse::resetOutput() {
    for(int i = 0; i < output.size(); i++) {
        if(output[i]) {
            delete output[i];
            output[i] = NULL;
        }
    }
}